

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint __uval;
  uint __val;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  string __str;
  allocator_type local_79;
  char *local_78;
  ulong local_70;
  char local_68 [16];
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_78 = (char *)CONCAT71(local_78._1_7_,1);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,1000,(bool *)&local_78,&local_79);
  uVar8 = (ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p) * 8;
  auVar15._8_4_ = (int)(uVar8 >> 0x20);
  auVar15._0_8_ = uVar8;
  auVar15._12_4_ = 0x45300000;
  dVar14 = SQRT((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
  if (2.0 < dVar14) {
    uVar9 = 2;
    do {
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6 & 0x3ffffff] >> (uVar9 & 0x3f) & 1) !=
          0) {
        for (uVar7 = (ulong)(int)((double)(int)uVar9 * (double)(int)uVar9); uVar7 < uVar8;
            uVar7 = uVar7 + uVar9) {
          iVar2 = (int)uVar7;
          iVar11 = iVar2 + 0x3f;
          if (-1 < iVar2) {
            iVar11 = iVar2;
          }
          bVar1 = (byte)uVar7 & 0x3f;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [(long)(iVar11 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [(long)(iVar11 >> 6) +
                ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
               (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        }
      }
      uVar9 = uVar9 + 1;
    } while ((double)(int)uVar9 < dVar14);
  }
  __val = (int)uVar8 - 1;
  if (1 < (int)__val) {
    do {
      uVar8 = (ulong)__val;
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[__val >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
        uVar10 = 1;
        if (9 < __val) {
          uVar3 = 4;
          do {
            uVar10 = uVar3;
            uVar4 = (uint)uVar8;
            if (uVar4 < 100) {
              uVar10 = uVar10 - 2;
              goto LAB_00101449;
            }
            if (uVar4 < 1000) {
              uVar10 = uVar10 - 1;
              goto LAB_00101449;
            }
            if (uVar4 < 10000) goto LAB_00101449;
            uVar8 = uVar8 / 10000;
            uVar3 = uVar10 + 4;
          } while (99999 < uVar4);
          uVar10 = uVar10 + 1;
        }
LAB_00101449:
        local_78 = local_68;
        std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_78,uVar10,__val);
        bVar13 = true;
        if (-2 < (int)local_70) {
          if (*local_78 == local_78[(long)((local_70 << 0x20) + -0x100000000) >> 0x20]) {
            uVar10 = (int)(((uint)(local_70 >> 0x1f) & 1) + (int)local_70) >> 1;
            lVar5 = (local_70 << 0x20) + -0x200000000;
            uVar8 = 0;
            do {
              uVar9 = uVar8;
              if ((ulong)(uVar10 + 1) - 1 == uVar9) break;
              lVar12 = lVar5 >> 0x20;
              lVar5 = lVar5 + -0x100000000;
              uVar8 = uVar9 + 1;
            } while (local_78[uVar9 + 1] == local_78[lVar12]);
            bVar13 = uVar10 <= uVar9;
          }
          else {
            bVar13 = false;
          }
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if (bVar13) {
          plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,__val);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          break;
        }
      }
      bVar13 = 2 < (int)__val;
      __val = __val - 1;
    } while (bVar13);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    vector<bool> primes(1000,true);

    for(int i = 2; i<sqrt(primes.size());i++){
        if(primes[i] == true){
            for(int j = pow(i,2); j < primes.size(); j+=i){
                primes[j] = false;
            }
        }
    }

    for(int i = primes.size()-1; i >= 2; i--){
        if(primes[i]){
            if(isPalindrome(to_string(i))) {
                std::cout << i << std::endl;
                break;
            }
        }
    };
    return 0;
}